

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O3

void __thiscall
front::symbol::IntSymbol::IntSymbol
          (IntSymbol *this,string *name,int layer_num,bool is_const,int value)

{
  pointer pcVar1;
  int iVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR___cxa_pure_virtual_001eca28;
  (this->super_Symbol)._name._M_dataplus._M_p = (pointer)&(this->super_Symbol)._name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Symbol)._name,local_50,local_48 + (long)local_50);
  (this->super_Symbol)._layerNum = layer_num;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001ecae0;
  this->_is_const = is_const;
  this->_value = value;
  this->_size = 4;
  iVar2 = Symbol::symbolId + 1;
  (this->super_Symbol).id = Symbol::symbolId;
  Symbol::symbolId = iVar2;
  return;
}

Assistant:

IntSymbol(string name, int layer_num, bool is_const, int value = 0)
      : _is_const(is_const), _value(value), Symbol(name, layer_num) {
    id = Symbol::symbolId++;
  }